

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionCompiler.cpp
# Opt level: O2

void __thiscall
Refal2::CLeftPartCompiler::CompileLeftPart
          (CLeftPartCompiler *this,CUnitList *leftPart,bool isRightDirection)

{
  CNodeType **ppCVar1;
  CNodeType *pCVar2;
  CUnitNode *unit;
  bool bVar3;
  CNode<Refal2::CHole> **ppCVar4;
  CHole local_40;
  
  this->top = 2;
  CHole::CHole(&local_40,leftPart,0,1);
  CNodeList<Refal2::CHole>::Append(&this->holes,&local_40);
  CNodeList<Refal2::CUnit>::~CNodeList((CNodeList<Refal2::CUnit> *)&local_40);
  ppCVar1 = &(this->holes).first;
  this->lastUsedHole = (this->holes).first;
  ppCVar4 = ppCVar1;
  while( true ) {
    while( true ) {
      pCVar2 = *ppCVar4;
      this->hole = pCVar2;
      if (pCVar2 == (CNodeType *)0x0) break;
      unit = (pCVar2->super_CHole).super_CUnitList.super_CNodeList<Refal2::CUnit>.first;
      if (((unit == (pCVar2->super_CHole).super_CUnitList.super_CNodeList<Refal2::CUnit>.last) ||
          (bVar3 = isFreeVE(this,unit), !bVar3)) ||
         (bVar3 = isFreeVE(this,(this->hole->super_CHole).super_CUnitList.
                                super_CNodeList<Refal2::CUnit>.last), !bVar3)) {
        matchElement(this);
        ppCVar4 = ppCVar1;
      }
      else {
        ppCVar4 = &this->hole->next;
      }
    }
    if (*ppCVar1 == (CNodeType *)0x0) break;
    this->hole = *ppCVar1;
    matchVE(this,isRightDirection);
    ppCVar4 = ppCVar1;
  }
  if (this->maxTableSize < this->top) {
    this->maxTableSize = this->top;
  }
  return;
}

Assistant:

void CLeftPartCompiler::CompileLeftPart( CUnitList& leftPart,
	bool isRightDirection )
{
	top = 2;
	holes.Append( CHole( leftPart, 0 /* left */, 1 /* right */ ) );
	lastUsedHole = holes.GetFirst();

	while( true ) {
		hole = holes.GetFirst();

		while( hole != 0 ) {
			if( hole->GetFirst() != hole->GetLast()
				&& isFreeVE( hole->GetFirst() ) && isFreeVE( hole->GetLast() ) )
			{
				hole = hole->Next();
			} else {
				matchElement();
				hole = holes.GetFirst();
			}
		}

		if( holes.IsEmpty() ) {
			break;
		} else {
			hole = holes.GetFirst();
			matchVE( isRightDirection );
		}
	}

	if( top > maxTableSize ) {
		maxTableSize = top;
	}
}